

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::SPxMainSM<double>::removeEmpty(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  SPxOut *pSVar1;
  bool bVar2;
  int iVar3;
  Verbosity VVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  SVectorBase<double> *this_00;
  double *args_4;
  SPxLPBase<double> *in_RSI;
  SPxMainSM<double> *in_RDI;
  double dVar8;
  Verbosity old_verbosity;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr2;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr1;
  double val;
  SVectorBase<double> *col;
  int j;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  SVectorBase<double> *row;
  int i;
  int remCols;
  int remRows;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  SPxLPBase<double> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  SPxMainSM<double> *in_stack_fffffffffffffe60;
  SPxMainSM<double> *in_stack_fffffffffffffe70;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  SPxLPBase<double> *in_stack_fffffffffffffe98;
  EmptyConstraintPS *in_stack_fffffffffffffea0;
  double dVar9;
  undefined1 correctIdx;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffee8;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffef0;
  SPxLPBase<double> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  SPxLPBase<double> *in_stack_ffffffffffffff08;
  FixVariablePS *in_stack_ffffffffffffff10;
  undefined4 local_cc;
  Verbosity local_c8;
  undefined1 local_c1;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar10;
  double in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  SPxLPBase<double> *in_stack_ffffffffffffff78;
  FixBoundsPS *in_stack_ffffffffffffff80;
  SPxMainSM<double> *local_78;
  int local_64;
  undefined1 local_5d;
  undefined1 local_50 [80];
  
  local_50._52_4_ = 0;
  local_50._48_4_ = 0;
  local_50._56_8_ = in_RSI;
  local_50._44_4_ = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2907ba);
  while( true ) {
    do {
      local_50._44_4_ = local_50._44_4_ + -1;
      if ((int)local_50._44_4_ < 0) {
        local_64 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x290adb);
        do {
          do {
            local_64 = local_64 + -1;
            if (local_64 < 0) {
              if (0 < (int)(local_50._52_4_ + local_50._48_4_)) {
                (in_RDI->super_SPxSimplifier<double>).m_remRows =
                     local_50._52_4_ + (in_RDI->super_SPxSimplifier<double>).m_remRows;
                (in_RDI->super_SPxSimplifier<double>).m_remCols =
                     local_50._48_4_ + (in_RDI->super_SPxSimplifier<double>).m_remCols;
                if (((in_RDI->super_SPxSimplifier<double>).spxout != (SPxOut *)0x0) &&
                   (VVar4 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout),
                   3 < (int)VVar4)) {
                  local_c8 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout);
                  pSVar1 = (in_RDI->super_SPxSimplifier<double>).spxout;
                  local_cc = 4;
                  (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_cc);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe50,
                                     (char *)CONCAT44(in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe48));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe50,
                                     (char *)CONCAT44(in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe48));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe50,
                                     (char *)CONCAT44(in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe48));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffe50,
                                     (_func_ostream_ptr_ostream_ptr *)
                                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
                  pSVar1 = (in_RDI->super_SPxSimplifier<double>).spxout;
                  (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_c8);
                }
              }
              return OKAY;
            }
            this_00 = SPxLPBase<double>::colVector
                                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
            iVar3 = SVectorBase<double>::size(this_00);
          } while (iVar3 != 0);
          pdVar5 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          args_4 = SPxLPBase<double>::upper(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          SPxOut::
          debug<soplex::SPxMainSM<double>,_const_char_(&)[54],_int_&,_const_double_&,_const_double_&,_const_double_&,_0>
                    (in_RDI,(char (*) [54])"IMAISM08 col {}: empty -> maxObj={} lower={} upper={}",
                     &local_64,pdVar5,pdVar6,args_4);
          pdVar5 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          dVar9 = *pdVar5;
          dVar8 = epsZero(in_stack_fffffffffffffe70);
          bVar2 = GT<double,double,double>(dVar9,0.0,dVar8);
          correctIdx = (undefined1)((ulong)dVar9 >> 0x38);
          if (bVar2) {
            pdVar5 = SPxLPBase<double>::upper(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
            dVar9 = *pdVar5;
            pdVar5 = (double *)infinity();
            if (*pdVar5 <= dVar9) {
              SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[12],_0>
                        (in_RDI,(char (*) [12])0x7ebe7c);
              return UNBOUNDED;
            }
            pdVar5 = SPxLPBase<double>::upper(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
            local_78 = (SPxMainSM<double> *)*pdVar5;
          }
          else {
            pdVar5 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
            dVar9 = *pdVar5;
            dVar8 = epsZero(in_stack_fffffffffffffe70);
            bVar2 = LT<double,double,double>(dVar9,0.0,dVar8);
            if (bVar2) {
              pdVar5 = SPxLPBase<double>::lower(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
              ;
              dVar9 = *pdVar5;
              pdVar5 = (double *)infinity();
              if (dVar9 <= -*pdVar5) {
                SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[12],_0>
                          (in_RDI,(char (*) [12])0x7ebe7c);
                return UNBOUNDED;
              }
              pdVar5 = SPxLPBase<double>::lower(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
              ;
              local_78 = (SPxMainSM<double> *)*pdVar5;
            }
            else {
              pdVar5 = SPxLPBase<double>::lower(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
              ;
              dVar9 = *pdVar5;
              pdVar5 = (double *)infinity();
              if (dVar9 <= -*pdVar5) {
                pdVar5 = SPxLPBase<double>::upper
                                   (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
                dVar9 = *pdVar5;
                pdVar5 = (double *)infinity();
                if (*pdVar5 <= dVar9) {
                  local_78 = (SPxMainSM<double> *)0x0;
                }
                else {
                  pdVar5 = SPxLPBase<double>::upper
                                     (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
                  local_78 = (SPxMainSM<double> *)*pdVar5;
                }
              }
              else {
                pdVar5 = SPxLPBase<double>::lower
                                   (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
                local_78 = (SPxMainSM<double> *)*pdVar5;
              }
            }
          }
          SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[10],_0>
                    (in_RDI,(char (*) [10])0x7eb329);
          operator_new(0x30);
          uVar10 = 1;
          std::shared_ptr<soplex::Tolerances>::shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffe50,
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          FixBoundsPS::FixBoundsPS
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                     in_stack_ffffffffffffff68,
                     (shared_ptr<soplex::Tolerances> *)CONCAT17(uVar10,in_stack_ffffffffffffff60));
          std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
          shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
                    ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)in_stack_fffffffffffffe50,
                     (FixBoundsPS *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x290ed3);
          in_stack_fffffffffffffe70 = (SPxMainSM<double> *)operator_new(0x78);
          local_c1 = 1;
          in_stack_fffffffffffffe50 = (SPxLPBase<double> *)local_50._56_8_;
          iVar3 = local_64;
          std::shared_ptr<soplex::Tolerances>::shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)local_50._56_8_,
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          FixVariablePS::FixVariablePS
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (SPxMainSM<double> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (double)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(bool)correctIdx);
          local_c1 = 0;
          std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
          shared_ptr<soplex::SPxMainSM<double>::FixVariablePS,void>
                    ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)in_stack_fffffffffffffe50,
                     (FixVariablePS *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
          ;
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x290f88);
          Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                    ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                     in_stack_fffffffffffffe50,
                     (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                    ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                     in_stack_fffffffffffffe50,
                     (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_50._48_4_ = local_50._48_4_ + 1;
          removeCol(local_78,(SPxLPBase<double> *)CONCAT44(iVar3,in_stack_fffffffffffffe58),
                    (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          piVar7 = DataArray<int>::operator[](&in_RDI->m_stat,4);
          *piVar7 = *piVar7 + 1;
          std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                    ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x29101f);
          std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                    ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x29102c);
        } while( true );
      }
      local_50._32_8_ =
           SPxLPBase<double>::rowVector(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      iVar3 = SVectorBase<double>::size((SVectorBase<double> *)local_50._32_8_);
    } while (iVar3 != 0);
    SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[26],_int_&,_0>
              (in_RDI,(char (*) [26])"IMAISM07 row {}: empty ->",(int *)(local_50 + 0x2c));
    pdVar5 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    dVar9 = *pdVar5;
    dVar8 = feastol(in_stack_fffffffffffffe70);
    bVar2 = LT<double,double,double>(dVar9,0.0,dVar8);
    if (bVar2) break;
    pdVar5 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    dVar9 = *pdVar5;
    dVar8 = feastol(in_stack_fffffffffffffe70);
    bVar2 = GT<double,double,double>(dVar9,0.0,dVar8);
    if (bVar2) break;
    SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[10],_0>(in_RDI,(char (*) [10])0x7eb329);
    in_stack_fffffffffffffee8 = (shared_ptr<soplex::Tolerances> *)operator_new(0x38);
    local_5d = 1;
    in_stack_ffffffffffffff08 = (SPxLPBase<double> *)local_50;
    in_stack_fffffffffffffef0 = in_stack_fffffffffffffee8;
    in_stack_fffffffffffffef8 = (SPxLPBase<double> *)local_50._56_8_;
    in_stack_ffffffffffffff04 = local_50._44_4_;
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffe50,
               (shared_ptr<soplex::Tolerances> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    EmptyConstraintPS::EmptyConstraintPS
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
               in_stack_fffffffffffffe88);
    local_5d = 0;
    std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
    shared_ptr<soplex::SPxMainSM<double>::EmptyConstraintPS,void>
              ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)in_stack_fffffffffffffe50,
               (EmptyConstraintPS *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2909d4);
    Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
              ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
               in_stack_fffffffffffffe50,
               (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_50._52_4_ = local_50._52_4_ + 1;
    removeRow(in_stack_fffffffffffffe60,
              (SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
              (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    piVar7 = DataArray<int>::operator[](&in_RDI->m_stat,0);
    *piVar7 = *piVar7 + 1;
    std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
              ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x290a4a);
  }
  pdVar5 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[27],_const_double_&,_const_double_&,_0>
            (in_RDI,(char (*) [27])" infeasible lhs={} rhs={}\n",pdVar5,pdVar6);
  return INFEASIBLE;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}